

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O3

void embree::updateEdgeLevelBuffer(ISPCSubdivMesh *mesh,Vec3fa *cam_pos,uint startID,uint endID)

{
  Vec3fa *pVVar1;
  Vec3fa *pVVar2;
  uint uVar3;
  ulong uVar4;
  uint f;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vfloat4 a;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (startID < endID) {
    uVar4 = (ulong)startID;
    do {
      uVar7 = mesh->verticesPerFace[uVar4];
      uVar5 = (ulong)uVar7;
      if (uVar5 != 0) {
        uVar3 = mesh->face_offsets[uVar4];
        if (uVar7 == 4) {
          lVar6 = 0;
          do {
            uVar7 = uVar3 + (int)lVar6;
            lVar6 = lVar6 + 1;
            pVVar1 = *mesh->positions + mesh->position_indices[uVar7];
            pVVar2 = *mesh->positions + mesh->position_indices[((uint)lVar6 & 3) + uVar3];
            fVar14 = (pVVar2->field_0).m128[0] - (pVVar1->field_0).m128[0];
            fVar15 = (pVVar2->field_0).m128[1] - (pVVar1->field_0).m128[1];
            fVar16 = (pVVar2->field_0).m128[2] - (pVVar1->field_0).m128[2];
            fVar11 = ((pVVar1->field_0).m128[0] + (pVVar2->field_0).m128[0]) * -0.5 +
                     (cam_pos->field_0).m128[0];
            fVar12 = ((pVVar1->field_0).m128[1] + (pVVar2->field_0).m128[1]) * -0.5 +
                     (cam_pos->field_0).m128[1];
            fVar13 = ((pVVar1->field_0).m128[2] + (pVVar2->field_0).m128[2]) * -0.5 +
                     (cam_pos->field_0).m128[2];
            fVar11 = ((SQRT(fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14) * 0.5) /
                     SQRT(fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11)) * 64.0;
            if (64.0 <= fVar11) {
              fVar11 = 64.0;
            }
            fVar12 = 4.0;
            if (4.0 <= fVar11) {
              fVar12 = fVar11;
            }
            mesh->subdivlevel[uVar7] = fVar12;
          } while (lVar6 != 4);
        }
        else if (uVar7 == 3) {
          lVar6 = 0;
          do {
            uVar7 = uVar3 + (int)lVar6;
            bVar10 = lVar6 == 2;
            lVar6 = lVar6 + 1;
            iVar8 = (int)lVar6;
            if (bVar10) {
              iVar8 = 0;
            }
            pVVar1 = *mesh->positions + mesh->position_indices[uVar7];
            pVVar2 = *mesh->positions + mesh->position_indices[iVar8 + uVar3];
            fVar14 = (pVVar2->field_0).m128[0] - (pVVar1->field_0).m128[0];
            fVar15 = (pVVar2->field_0).m128[1] - (pVVar1->field_0).m128[1];
            fVar16 = (pVVar2->field_0).m128[2] - (pVVar1->field_0).m128[2];
            fVar11 = ((pVVar1->field_0).m128[0] + (pVVar2->field_0).m128[0]) * -0.5 +
                     (cam_pos->field_0).m128[0];
            fVar12 = ((pVVar1->field_0).m128[1] + (pVVar2->field_0).m128[1]) * -0.5 +
                     (cam_pos->field_0).m128[1];
            fVar13 = ((pVVar1->field_0).m128[2] + (pVVar2->field_0).m128[2]) * -0.5 +
                     (cam_pos->field_0).m128[2];
            fVar11 = ((SQRT(fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14) * 0.5) /
                     SQRT(fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11)) * 64.0;
            if (64.0 <= fVar11) {
              fVar11 = 64.0;
            }
            fVar12 = 4.0;
            if (4.0 <= fVar11) {
              fVar12 = fVar11;
            }
            mesh->subdivlevel[uVar7] = fVar12;
          } while (lVar6 != 3);
        }
        else {
          uVar9 = 0;
          do {
            uVar7 = uVar3 + (int)uVar9;
            bVar10 = uVar5 - 1 == uVar9;
            uVar9 = uVar9 + 1;
            iVar8 = (int)uVar9;
            if (bVar10) {
              iVar8 = 0;
            }
            pVVar1 = *mesh->positions + mesh->position_indices[uVar7];
            pVVar2 = *mesh->positions + mesh->position_indices[iVar8 + uVar3];
            fVar14 = (pVVar2->field_0).m128[0] - (pVVar1->field_0).m128[0];
            fVar15 = (pVVar2->field_0).m128[1] - (pVVar1->field_0).m128[1];
            fVar16 = (pVVar2->field_0).m128[2] - (pVVar1->field_0).m128[2];
            fVar11 = ((pVVar1->field_0).m128[0] + (pVVar2->field_0).m128[0]) * -0.5 +
                     (cam_pos->field_0).m128[0];
            fVar12 = ((pVVar1->field_0).m128[1] + (pVVar2->field_0).m128[1]) * -0.5 +
                     (cam_pos->field_0).m128[1];
            fVar13 = ((pVVar1->field_0).m128[2] + (pVVar2->field_0).m128[2]) * -0.5 +
                     (cam_pos->field_0).m128[2];
            fVar11 = ((SQRT(fVar16 * fVar16 + fVar15 * fVar15 + fVar14 * fVar14) * 0.5) /
                     SQRT(fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11)) * 64.0;
            if (64.0 <= fVar11) {
              fVar11 = 64.0;
            }
            fVar12 = 4.0;
            if (4.0 <= fVar11) {
              fVar12 = fVar11;
            }
            mesh->subdivlevel[uVar7] = fVar12;
          } while (uVar5 != uVar9);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != endID);
  }
  return;
}

Assistant:

void updateEdgeLevelBuffer( ISPCSubdivMesh* mesh, const Vec3fa& cam_pos, unsigned int startID, unsigned int endID )
{
  for (unsigned int f=startID; f<endID;f++) {
    unsigned int e = mesh->face_offsets[f];
    unsigned int N = mesh->verticesPerFace[f];
    if (N == 4) /* fast path for quads */
      for (unsigned int i=0; i<4; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%4);
    else if (N == 3) /* fast path for triangles */
      for (unsigned int i=0; i<3; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%3);
    else /* fast path for general polygons */
      for (unsigned int i=0; i<N; i++)
        mesh->subdivlevel[e+i] =  updateEdgeLevel(mesh,cam_pos,e+(i+0),e+(i+1)%N);
  }
}